

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

int32 solve(float32 **a,float32 *b,float32 *out_x,int32 n)

{
  undefined8 *tmpptr;
  char uplo;
  int32 nrhs;
  int32 info;
  int32 n_local;
  
  n_local = n;
  tmpptr = (undefined8 *)
           __ckd_calloc_2d__((long)n,(long)n,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/matrix.c"
                             ,0xba);
  memcpy((void *)*tmpptr,*a,(ulong)(uint)(n_local * n_local) << 2);
  memcpy(out_x,b,(long)n_local << 2);
  uplo = 'L';
  nrhs = 1;
  sposv_(&uplo,&n_local,&nrhs,(real *)*tmpptr,&n_local,(real *)out_x,&n_local,&info);
  ckd_free_2d(tmpptr);
  return -(uint)(info != 0);
}

Assistant:

int32
solve(float32 **a, /*Input : an n*n matrix A */
      float32 *b,  /*Input : a n dimesion vector b */
      float32 *out_x,  /*Output : a n dimesion vector x */
      int32   n)
{
    char uplo;
    float32 **tmp_a;
    int32 info, nrhs;

    /* a is assumed to be symmetric, so we don't need to switch the
     * ordering of the data.  But we do need to copy it since it is
     * overwritten by LAPACK. */
    tmp_a = (float32 **)ckd_calloc_2d(n, n, sizeof(float32));
    memcpy(tmp_a[0], a[0], n*n*sizeof(float32));
    memcpy(out_x, b, n*sizeof(float32));
    uplo = 'L';
    nrhs = 1;
    sposv_(&uplo, &n, &nrhs, tmp_a[0], &n, out_x, &n, &info);
    ckd_free_2d((void **)tmp_a);

    if (info != 0)
	return -1;
    else
	return info;
}